

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.cpp
# Opt level: O2

IOHANDLE __thiscall
CStorage::OpenFile(CStorage *this,char *pFilename,int Flags,int Type,char *pBuffer,int BufferSize,
                  FCheckCallback pfnCheckCB,void *pCheckCBData)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char *filename;
  IOHANDLE io;
  uint BufferSize_00;
  int i;
  long in_FS_OFFSET;
  int local_244;
  char local_238 [512];
  long local_38;
  
  BufferSize_00 = 0x200;
  if (pBuffer != (char *)0x0) {
    BufferSize_00 = BufferSize;
  }
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar3 = local_238;
  if (pBuffer != (char *)0x0) {
    pcVar3 = pBuffer;
  }
  iVar2 = str_path_unsafe(pFilename);
  if (iVar2 == 0) {
    if ((Flags & 2U) == 0) {
      local_244 = this->m_NumPaths;
      if (Type < local_244 && -1 < Type) {
        local_244 = Type + 1;
      }
      else {
        dbg_assert_imp("/workspace/llm4binary/github/license_all_cmakelists_1510/TsFreddie[P]teeworlds/src/engine/shared/storage.cpp"
                       ,0x173,(uint)(Type == -1),"invalid storage type");
        Type = 0;
      }
      for (; Type < local_244; Type = Type + 1) {
        filename = GetPath(this,Type,pFilename,pcVar3,BufferSize_00);
        io = io_open(filename,Flags);
        if (io != (IOHANDLE)0x0) {
          if (pfnCheckCB == (FCheckCallback)0x0) goto LAB_001399cd;
          bVar1 = (*pfnCheckCB)(io,pCheckCBData);
          if (bVar1) goto LAB_001399cd;
          io_close(io);
        }
      }
      *pcVar3 = '\0';
      io = (IOHANDLE)0x0;
    }
    else {
      pcVar3 = GetPath(this,0,pFilename,pcVar3,BufferSize_00);
      io = io_open(pcVar3,Flags);
    }
  }
  else {
    io = (IOHANDLE)0x0;
    dbg_msg("storage",
            "refusing to open path which looks like it could escape those specified in \'storage.cfg\': %s"
            ,pFilename);
  }
LAB_001399cd:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return io;
  }
  __stack_chk_fail();
}

Assistant:

virtual IOHANDLE OpenFile(const char *pFilename, int Flags, int Type, char *pBuffer = 0, int BufferSize = 0, FCheckCallback pfnCheckCB = 0, const void *pCheckCBData = 0)
	{
		char aBuffer[IO_MAX_PATH_LENGTH];
		if(!pBuffer)
		{
			pBuffer = aBuffer;
			BufferSize = sizeof(aBuffer);
		}

		// Check whether the path contains '..' (parent directory) paths. We'd
		// normally still have to check whether it is an absolute path
		// (starts with a path separator (or a drive name on windows)),
		// but since we concatenate this path with another path later
		// on, this can't become absolute.
		//
		// E. g. "/etc/passwd" => "/path/to/storage//etc/passwd", which
		// is safe.
		if(str_path_unsafe(pFilename) != 0)
		{
			dbg_msg("storage", "refusing to open path which looks like it could escape those specified in 'storage.cfg': %s", pFilename);
			return 0;
		}

		// open file
		if(Flags&IOFLAG_WRITE)
		{
			return io_open(GetPath(TYPE_SAVE, pFilename, pBuffer, BufferSize), Flags);
		}
		else
		{
			IOHANDLE Handle = 0;
			int LB = 0, UB = m_NumPaths;	// check all available directories

			if(Type >= 0 && Type < m_NumPaths)	// check wanted directory
			{
				LB = Type;
				UB = Type + 1;
			}
			else
				dbg_assert(Type == TYPE_ALL, "invalid storage type");

			for(int i = LB; i < UB; ++i)
			{
				Handle = io_open(GetPath(i, pFilename, pBuffer, BufferSize), Flags);
				if(Handle)
				{
					// do an additional check on the file
					if(pfnCheckCB && !pfnCheckCB(Handle, pCheckCBData))
					{
						io_close(Handle);
						Handle = 0;
					}
					else
						return Handle;
				}
			}
		}

		pBuffer[0] = 0;
		return 0;
	}